

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

Expression * __thiscall
soul::ResolutionPass::ConstantFolder::convertExpressionListToConstant
          (ConstantFolder *this,Expression *expr,Type *targetType,CommaSeparatedList *list)

{
  Member *pMVar1;
  Allocator *pAVar2;
  long *plVar3;
  bool bVar4;
  char cVar5;
  CastType CVar6;
  ArraySize numberAvailable;
  Structure *this_00;
  Constant *pCVar7;
  CommaSeparatedList *list_00;
  Expression *pEVar8;
  undefined8 extraout_RDX;
  ulong uVar9;
  Context *errorContext;
  complex<float> v;
  Value *in_R8;
  ulong uVar10;
  long lVar11;
  ArrayView<soul::Value> members;
  ArrayView<soul::Value> elements;
  ArrayView<soul::Value> elements_00;
  complex<double> v_00;
  pool_ptr<soul::AST::Constant> constant;
  pool_ptr<soul::AST::Constant> imag;
  pool_ptr<soul::AST::Constant> constant_1;
  pool_ptr<soul::AST::Constant> real;
  Type memberType;
  ArrayWithPreallocation<soul::Value,_8UL> memberValues;
  Type local_3a0;
  Context *local_388;
  Expression *local_380;
  Value local_378;
  Expression *local_338;
  Value local_330;
  Type *local_2f0;
  undefined1 local_2e8 [24];
  undefined1 local_2d0 [24];
  undefined1 local_2b8 [536];
  CompileMessage local_a0;
  CompileMessage local_68;
  
  errorContext = &(expr->super_Statement).super_ASTObject.context;
  numberAvailable =
       TypeRules::checkArraySizeAndThrowErrorIfIllegal<soul::AST::Context&,unsigned_long>
                 (errorContext,(list->items).numActive);
  if (targetType->category == structure) {
    local_388 = errorContext;
    SanityCheckPass::throwErrorIfWrongNumberOfElements(errorContext,targetType,numberAvailable);
    this_00 = Type::getStructRef(targetType);
    local_2b8._0_8_ = local_2b8 + 0x18;
    local_2b8._8_8_ = (uchar *)0x0;
    local_2b8._16_8_ = (Structure *)0x8;
    ArrayWithPreallocation<soul::Value,_8UL>::reserve
              ((ArrayWithPreallocation<soul::Value,_8UL> *)local_2b8,(this_00->members).numActive);
    if (numberAvailable != 0) {
      lVar11 = 0x10;
      uVar9 = 0;
      do {
        if ((this_00->members).numActive <= uVar9) {
          throwInternalCompilerError("index < numActive","operator[]",0x9f);
        }
        pMVar1 = (this_00->members).items;
        local_330.type._0_4_ = *(undefined4 *)((long)pMVar1 + lVar11 + -0x10);
        local_330.type.primitiveType.type = *(Primitive *)((long)pMVar1 + lVar11 + -0xc);
        local_330.type._8_8_ = *(undefined8 *)((long)pMVar1 + lVar11 + -8);
        local_330.type.structure.object = *(Structure **)(&(pMVar1->type).category + lVar11);
        if (local_330.type.structure.object != (Structure *)0x0) {
          ((local_330.type.structure.object)->super_RefCountedObject).refCount =
               ((local_330.type.structure.object)->super_RefCountedObject).refCount + 1;
        }
        if ((list->items).numActive <= uVar9) {
          throwInternalCompilerError("index < numActive","operator[]",0x9e);
        }
        (*(((list->items).items[uVar9].object)->super_Statement).super_ASTObject._vptr_ASTObject
          [0xd])(&local_3a0);
        plVar3 = (long *)CONCAT44(local_3a0.primitiveType.type,local_3a0._0_4_);
        if (plVar3 == (long *)0x0) {
LAB_0021bf1c:
          bVar4 = false;
        }
        else {
          cVar5 = (**(code **)(*plVar3 + 0x80))(plVar3,&local_330);
          if (cVar5 == '\0') {
            if ((this->super_ErrorIgnoringRewritingASTVisitor).ignoreErrors == false) {
              pEVar8 = (Expression *)CONCAT44(local_3a0.primitiveType.type,local_3a0._0_4_);
              if (pEVar8 == (Expression *)0x0) {
                throwInternalCompilerError("object != nullptr","operator->",0x3c);
              }
              SanityCheckPass::expectSilentCastPossible
                        (&(pEVar8->super_Statement).super_ASTObject.context,&local_330.type,pEVar8);
            }
            goto LAB_0021bf1c;
          }
          if (CONCAT44(local_3a0.primitiveType.type,local_3a0._0_4_) == 0) {
            throwInternalCompilerError("object != nullptr","operator->",0x3c);
          }
          soul::Value::castToTypeExpectingSuccess
                    (&local_378,
                     (Value *)(CONCAT44(local_3a0.primitiveType.type,local_3a0._0_4_) + 0x30),
                     &local_330.type);
          ArrayWithPreallocation<soul::Value,_8UL>::push_back
                    ((ArrayWithPreallocation<soul::Value,_8UL> *)local_2b8,&local_378);
          soul::Value::~Value(&local_378);
          bVar4 = true;
        }
        RefCountedPtr<soul::Structure>::decIfNotNull(local_330.type.structure.object);
        if (!bVar4) goto LAB_0021c182;
        uVar9 = uVar9 + 1;
        lVar11 = lVar11 + 0x40;
      } while (numberAvailable != uVar9);
    }
    pAVar2 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
    members.s = (Value *)(((ArrayWithPreallocation<soul::Structure::Member,_8UL> *)
                          (local_2b8._0_8_ + 0x18))->space + local_2b8._8_8_ * 8 + -6);
    members.e = in_R8;
    soul::Value::createStruct(&local_378,(Value *)this_00,(Structure *)local_2b8._0_8_,members);
    expr = &PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                      (&pAVar2->pool,local_388,&local_378)->super_Expression;
    soul::Value::~Value(&local_378);
LAB_0021c182:
    ArrayWithPreallocation<soul::Value,_8UL>::clear
              ((ArrayWithPreallocation<soul::Value,_8UL> *)local_2b8);
    return &((Constant *)expr)->super_Expression;
  }
  if ((targetType->category & ~primitive) != vector) {
    if ((targetType->primitiveType).type - complex32 < 2) {
      if (numberAvailable != 2) {
        CompileMessageHelpers::createMessage<>
                  (&local_68,syntax,error,"Too many initialisers for complex number");
        AST::Context::throwError(errorContext,&local_68,false);
      }
      if ((list->items).numActive == 0) {
        throwInternalCompilerError("index < numActive","operator[]",0x9e);
      }
      (*(((list->items).items)->object->super_Statement).super_ASTObject._vptr_ASTObject[0xd])
                (&local_338);
      if ((list->items).numActive < 2) {
        throwInternalCompilerError("index < numActive","operator[]",0x9e);
      }
      (*(((list->items).items[1].object)->super_Statement).super_ASTObject._vptr_ASTObject[0xd])
                (&local_380);
      if (local_338 == (Expression *)0x0) {
        return expr;
      }
      if (local_380 == (Expression *)0x0) {
        return expr;
      }
      local_3a0.primitiveType.type = (targetType->primitiveType).type == complex32 ^ float64;
      local_3a0.category = primitive;
      local_3a0.arrayElementCategory = invalid;
      local_3a0.isRef = false;
      local_3a0.isConstant = false;
      local_3a0.boundingSize = 0;
      local_3a0.arrayElementBoundingSize = 0;
      local_3a0.structure.object = (Structure *)0x0;
      SanityCheckPass::expectSilentCastPossible
                (&(local_338->super_Statement).super_ASTObject.context,&local_3a0,local_338);
      if (local_380 == (Expression *)0x0) {
        throwInternalCompilerError("object != nullptr","operator->",0x3c);
      }
      SanityCheckPass::expectSilentCastPossible
                (&(local_380->super_Statement).super_ASTObject.context,&local_3a0,local_380);
      if (local_338 == (Expression *)0x0) {
        throwInternalCompilerError("object != nullptr","operator->",0x3c);
      }
      soul::Value::castToTypeExpectingSuccess
                ((Value *)local_2b8,(Value *)(local_338 + 1),&local_3a0);
      if (local_380 != (Expression *)0x0) {
        v._M_value = (_ComplexT)(local_380 + 1);
        soul::Value::castToTypeExpectingSuccess(&local_378,(Value *)v._M_value,&local_3a0);
        if ((targetType->primitiveType).type == complex32) {
          soul::Value::getAsFloat((Value *)local_2b8);
          soul::Value::getAsFloat(&local_378);
          soul::Value::Value(&local_330,v);
        }
        else {
          soul::Value::getAsDouble((Value *)local_2b8);
          soul::Value::getAsDouble(&local_378);
          v_00._M_value._8_8_ = extraout_RDX;
          v_00._M_value._0_8_ = v._M_value;
          soul::Value::Value(&local_330,v_00);
        }
        pCVar7 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value&>
                           (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,
                            errorContext,&local_330);
        soul::Value::~Value(&local_330);
        soul::Value::~Value(&local_378);
        soul::Value::~Value((Value *)local_2b8);
        RefCountedPtr<soul::Structure>::decIfNotNull(local_3a0.structure.object);
        return &pCVar7->super_Expression;
      }
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
    if (1 < numberAvailable) {
      CompileMessageHelpers::createMessage<>
                (&local_a0,syntax,error,
                 "You can only create a multi-value initialiser list for an array, vector or struct"
                );
      AST::Context::throwError(errorContext,&local_a0,false);
    }
    if ((list->items).numActive == 0) {
LAB_0021c672:
      throwInternalCompilerError("! empty()","front",0xa7);
    }
    (*(((list->items).items)->object->super_Statement).super_ASTObject._vptr_ASTObject[0xd])
              (&local_378);
    if (local_378.type._0_8_ == 0) {
      return expr;
    }
    CVar6 = TypeRules::getCastType(targetType,(Type *)(local_378.type._0_8_ + 0x30));
    if (CVar6 == notPossible) {
      return expr;
    }
    if (local_378.type._0_8_ == 0) {
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
    pAVar2 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
    soul::Value::castToTypeExpectingSuccess
              ((Value *)local_2b8,(Value *)(local_378.type._0_8_ + 0x30),targetType);
    pCVar7 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                       (&pAVar2->pool,errorContext,(Value *)local_2b8);
LAB_0021c3e6:
    soul::Value::~Value((Value *)local_2b8);
    return &pCVar7->super_Expression;
  }
  if (numberAvailable == 1) {
    if ((list->items).numActive == 0) goto LAB_0021c672;
    (*(((list->items).items)->object->super_Statement).super_ASTObject._vptr_ASTObject[0xd])
              (&local_378);
    if (local_378.type._0_8_ == 0) {
      return expr;
    }
    CVar6 = TypeRules::getCastType(targetType,(Type *)(local_378.type._0_8_ + 0x30));
    if (CVar6 == notPossible) {
      return expr;
    }
    if (local_378.type._0_8_ == 0) {
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
    pAVar2 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
    soul::Value::castToTypeExpectingSuccess
              ((Value *)local_2b8,(Value *)(local_378.type._0_8_ + 0x30),targetType);
    pCVar7 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                       (&pAVar2->pool,errorContext,(Value *)local_2b8);
    goto LAB_0021c3e6;
  }
  SanityCheckPass::throwErrorIfWrongNumberOfElements(errorContext,targetType,numberAvailable);
  Type::getElementType(&local_330.type,targetType);
  local_2b8._0_8_ = local_2b8 + 0x18;
  local_2b8._8_8_ = (uchar *)0x0;
  local_2b8._16_8_ = (Structure *)0x8;
  ArrayWithPreallocation<soul::Value,_8UL>::reserve
            ((ArrayWithPreallocation<soul::Value,_8UL> *)local_2b8,numberAvailable);
  if (numberAvailable == 0) {
    if ((targetType->category == array) && (targetType->boundingSize == 0)) goto LAB_0021c412;
  }
  else {
    uVar9 = 0;
    local_388 = errorContext;
    local_2f0 = targetType;
    do {
      uVar10 = (list->items).numActive;
      if (uVar10 <= uVar9) {
        throwInternalCompilerError("index < numActive","operator[]",0x9e);
      }
      pEVar8 = (list->items).items[uVar9].object;
      if ((pEVar8 == (Expression *)0x0) ||
         (list_00 = (CommaSeparatedList *)
                    __dynamic_cast(pEVar8,&AST::Expression::typeinfo,
                                   &AST::CommaSeparatedList::typeinfo,0),
         list_00 == (CommaSeparatedList *)0x0)) {
LAB_0021c29e:
        if (uVar10 <= uVar9) {
          throwInternalCompilerError("index < numActive","operator[]",0x9e);
        }
        (*(((list->items).items[uVar9].object)->super_Statement).super_ASTObject._vptr_ASTObject
          [0xd])(&local_3a0);
        if ((CONCAT44(local_3a0.primitiveType.type,local_3a0._0_4_) == 0) ||
           (CVar6 = TypeRules::getCastType
                              (&local_330.type,
                               (Type *)(CONCAT44(local_3a0.primitiveType.type,local_3a0._0_4_) +
                                       0x30)), CVar6 == notPossible)) goto LAB_0021c512;
        if (CONCAT44(local_3a0.primitiveType.type,local_3a0._0_4_) == 0) {
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        soul::Value::castToTypeExpectingSuccess
                  (&local_378,
                   (Value *)(CONCAT44(local_3a0.primitiveType.type,local_3a0._0_4_) + 0x30),
                   &local_330.type);
        ArrayWithPreallocation<soul::Value,_8UL>::push_back
                  ((ArrayWithPreallocation<soul::Value,_8UL> *)local_2b8,&local_378);
      }
      else {
        pEVar8 = convertExpressionListToConstant(this,pEVar8,&local_330.type,list_00);
        lVar11 = __dynamic_cast(pEVar8,&AST::Expression::typeinfo,&AST::Constant::typeinfo,0);
        if (lVar11 == 0) {
          uVar10 = (list->items).numActive;
          goto LAB_0021c29e;
        }
        soul::Value::castToTypeExpectingSuccess(&local_378,(Value *)(lVar11 + 0x30),&local_330.type)
        ;
        ArrayWithPreallocation<soul::Value,_8UL>::push_back
                  ((ArrayWithPreallocation<soul::Value,_8UL> *)local_2b8,&local_378);
      }
      soul::Value::~Value(&local_378);
      targetType = local_2f0;
      errorContext = local_388;
      uVar9 = uVar9 + 1;
    } while (numberAvailable != uVar9);
    if ((local_2f0->category == array) && (local_2f0->boundingSize == 0)) {
LAB_0021c412:
      pAVar2 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
      Type::createCopyWithNewArraySize((Type *)local_2d0,targetType,numberAvailable);
      elements.s = (Value *)(local_2b8._0_8_ + local_2b8._8_8_ * 0x40);
      elements.e = in_R8;
      soul::Value::createArrayOrVector
                (&local_378,(Value *)local_2d0,(Type *)local_2b8._0_8_,elements);
      expr = &PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                        (&pAVar2->pool,errorContext,&local_378)->super_Expression;
      soul::Value::~Value(&local_378);
      RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_2d0._16_8_);
      goto LAB_0021c512;
    }
    SanityCheckPass::throwErrorIfWrongNumberOfElements(local_388,local_2f0,numberAvailable);
  }
  pAVar2 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
  local_2e8[0] = targetType->category;
  local_2e8[1] = targetType->arrayElementCategory;
  local_2e8[2] = targetType->isRef;
  local_2e8[3] = targetType->isConstant;
  local_2e8._4_4_ = (targetType->primitiveType).type;
  local_2e8._8_4_ = targetType->boundingSize;
  local_2e8._12_4_ = targetType->arrayElementBoundingSize;
  local_2e8._16_8_ = (targetType->structure).object;
  if ((Structure *)local_2e8._16_8_ != (Structure *)0x0) {
    (((Structure *)local_2e8._16_8_)->super_RefCountedObject).refCount =
         (((Structure *)local_2e8._16_8_)->super_RefCountedObject).refCount + 1;
  }
  elements_00.s = (Value *)(local_2b8._0_8_ + local_2b8._8_8_ * 0x40);
  elements_00.e = in_R8;
  soul::Value::createArrayOrVector
            (&local_378,(Value *)local_2e8,(Type *)local_2b8._0_8_,elements_00);
  expr = &PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                    (&pAVar2->pool,errorContext,&local_378)->super_Expression;
  soul::Value::~Value(&local_378);
  RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_2e8._16_8_);
LAB_0021c512:
  ArrayWithPreallocation<soul::Value,_8UL>::clear
            ((ArrayWithPreallocation<soul::Value,_8UL> *)local_2b8);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_330.type.structure.object);
  return &((Constant *)expr)->super_Expression;
}

Assistant:

AST::Expression& convertExpressionListToConstant (AST::Expression& expr, soul::Type& targetType, AST::CommaSeparatedList& list) const
        {
            auto numArgs = TypeRules::checkArraySizeAndThrowErrorIfIllegal (expr.context, list.items.size());

            if (targetType.isStruct())
            {
                SanityCheckPass::throwErrorIfWrongNumberOfElements (expr.context, targetType, numArgs);

                auto& s = targetType.getStructRef();

                ArrayWithPreallocation<Value, 8> memberValues;
                memberValues.reserve (s.getNumMembers());

                for (size_t i = 0; i < numArgs; ++i)
                {
                    auto memberType = s.getMemberType (i);

                    if (auto constant = list.items[i]->getAsConstant())
                    {
                        if (constant->canSilentlyCastTo (memberType))
                        {
                            memberValues.push_back (constant->value.castToTypeExpectingSuccess (memberType));
                            continue;
                        }

                        if (! ignoreErrors)
                            SanityCheckPass::expectSilentCastPossible (constant->context, memberType, *constant);
                    }

                    return expr;
                }

                return allocator.allocate<AST::Constant> (expr.context, Value::createStruct (s, memberValues));
            }
            else if (targetType.isArrayOrVector())
            {
                if (numArgs == 1)
                {
                    if (auto constant = list.items.front()->getAsConstant())
                        if (TypeRules::canCastTo (targetType, constant->value.getType()))
                            return allocator.allocate<AST::Constant> (expr.context, constant->value.castToTypeExpectingSuccess (targetType));

                    return expr;
                }

                SanityCheckPass::throwErrorIfWrongNumberOfElements (expr.context, targetType, numArgs);

                auto elementType = targetType.getElementType();

                ArrayWithPreallocation<Value, 8> elementValues;
                elementValues.reserve (numArgs);

                for (size_t i = 0; i < numArgs; ++i)
                {
                    if (auto itemList = cast<AST::CommaSeparatedList> (list.items[i]))
                    {
                        auto& e = convertExpressionListToConstant (list.items[i], elementType, *itemList);

                        if (auto constant = cast<AST::Constant> (e))
                        {
                            elementValues.push_back (constant->value.castToTypeExpectingSuccess (elementType));
                            continue;
                        }
                    }

                    if (auto constant = list.items[i]->getAsConstant())
                    {
                        if (TypeRules::canCastTo (elementType, constant->value.getType()))
                        {
                            elementValues.push_back (constant->value.castToTypeExpectingSuccess (elementType));
                            continue;
                        }
                    }

                    return expr;
                }

                if (targetType.isUnsizedArray())
                    return allocator.allocate<AST::Constant> (expr.context, Value::createArrayOrVector (targetType.createCopyWithNewArraySize (numArgs),
                                                                                                     elementValues));

                if (numArgs > 1)
                    SanityCheckPass::throwErrorIfWrongNumberOfElements (expr.context, targetType, numArgs);

                return allocator.allocate<AST::Constant> (expr.context, Value::createArrayOrVector (targetType, elementValues));
            }
            else if (targetType.isComplex())
            {
                if (numArgs != 2)
                    expr.context.throwError (Errors::wrongNumberOfComplexInitialisers());

                auto real = list.items[0]->getAsConstant();
                auto imag = list.items[1]->getAsConstant();

                if (real == nullptr || imag == nullptr)
                    return expr;

                auto attributeType = Type (targetType.isComplex32() ? PrimitiveType::float32 : PrimitiveType::float64);

                SanityCheckPass::expectSilentCastPossible (real->context, attributeType, *real);
                SanityCheckPass::expectSilentCastPossible (imag->context, attributeType, *imag);

                auto realValue = real->value.castToTypeExpectingSuccess (attributeType);
                auto imagValue = imag->value.castToTypeExpectingSuccess (attributeType);

                auto value = targetType.isComplex32() ? Value (std::complex<float> (realValue.getAsFloat(), imagValue.getAsFloat()))
                                                      : Value (std::complex<double> (realValue.getAsDouble(), imagValue.getAsDouble()));

                return allocator.allocate<AST::Constant> (expr.context, value);
            }

            if (numArgs > 1)
                expr.context.throwError (Errors::wrongTypeForInitialiseList());

            if (auto constant = list.items.front()->getAsConstant())
                if (TypeRules::canCastTo (targetType, constant->value.getType()))
                    return allocator.allocate<AST::Constant> (expr.context, constant->value.castToTypeExpectingSuccess (targetType));

            return expr;
        }